

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCreateFromGias(char *pName,Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Gia_Obj_t *pGVar5;
  Abc_Obj_t *pAVar6;
  Gia_Man_t *p;
  bool bVar7;
  Gia_Man_t *local_78;
  Abc_Obj_t *pAbcObj1_1;
  Abc_Obj_t *pAbcObj0_1;
  Abc_Obj_t *pAbcObj1;
  Abc_Obj_t *pAbcObj0;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Abc_Obj_t *pAbcObjPo;
  Abc_Obj_t *pAbcObj;
  Abc_Ntk_t *pNtk;
  Gia_Man_t *pGia;
  Gia_Man_t *pMulti_local;
  Vec_Ptr_t *vGias_local;
  char *pName_local;
  
  local_78 = pMulti;
  if (pMulti == (Gia_Man_t *)0x0) {
    local_78 = (Gia_Man_t *)Vec_PtrEntry(vGias,0);
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar3 = Extra_UtilStrsav(pName);
  pNtk_00->pName = pcVar3;
  for (pAbcObj0._0_4_ = 0; iVar1 = Gia_ManCiNum(local_78), (int)pAbcObj0 < iVar1;
      pAbcObj0._0_4_ = (int)pAbcObj0 + 1) {
    Abc_NtkCreatePi(pNtk_00);
  }
  if (pMulti == (Gia_Man_t *)0x0) {
    for (pAbcObj0._4_4_ = 0; iVar1 = Vec_PtrSize(vGias), pAbcObj0._4_4_ < iVar1;
        pAbcObj0._4_4_ = pAbcObj0._4_4_ + 1) {
      p = (Gia_Man_t *)Vec_PtrEntry(vGias,pAbcObj0._4_4_);
      iVar1 = Gia_ManCoNum(p);
      if (iVar1 != 1) {
        __assert_fail("Gia_ManCoNum(pGia) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                      ,0x8f4,"Abc_Ntk_t *Abc_NtkCreateFromGias(char *, Vec_Ptr_t *, Gia_Man_t *)");
      }
      Gia_ManCleanValue(p);
      pAbcObj0._0_4_ = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if ((int)pAbcObj0 < iVar1) {
          _k = Gia_ManCi(p,(int)pAbcObj0);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        pAVar4 = Abc_NtkCi(pNtk_00,(int)pAbcObj0);
        uVar2 = Abc_ObjId(pAVar4);
        _k->Value = uVar2;
        pAbcObj0._0_4_ = (int)pAbcObj0 + 1;
      }
      pAbcObj0._0_4_ = 0;
      while( true ) {
        bVar7 = false;
        if ((int)pAbcObj0 < p->nObjs) {
          _k = Gia_ManObj(p,(int)pAbcObj0);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(_k);
        if (iVar1 != 0) {
          pGVar5 = Gia_ObjFanin0(_k);
          pAVar4 = Abc_NtkObj(pNtk_00,pGVar5->Value);
          pGVar5 = Gia_ObjFanin1(_k);
          pAVar6 = Abc_NtkObj(pNtk_00,pGVar5->Value);
          iVar1 = Gia_ObjFaninC0(_k);
          pAVar4 = Abc_ObjNotCond(pAVar4,iVar1);
          iVar1 = Gia_ObjFaninC1(_k);
          pAVar6 = Abc_ObjNotCond(pAVar6,iVar1);
          pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar4,pAVar6);
          uVar2 = Abc_ObjId(pAVar4);
          _k->Value = uVar2;
        }
        pAbcObj0._0_4_ = (int)pAbcObj0 + 1;
      }
      _k = Gia_ManCo(p,0);
      iVar1 = Gia_ObjFaninId0p(p,_k);
      if (iVar1 == 0) {
        pAVar4 = Abc_AigConst1(pNtk_00);
        pAbcObjPo = Abc_ObjNot(pAVar4);
      }
      else {
        pGVar5 = Gia_ObjFanin0(_k);
        pAbcObjPo = Abc_NtkObj(pNtk_00,pGVar5->Value);
      }
      iVar1 = Gia_ObjFaninC0(_k);
      pAVar4 = Abc_ObjNotCond(pAbcObjPo,iVar1);
      pAVar6 = Abc_NtkCreatePo(pNtk_00);
      Abc_ObjAddFanin(pAVar6,pAVar4);
    }
  }
  else {
    Gia_ManCleanValue(local_78);
    pAbcObj0._0_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(local_78->vCis);
      bVar7 = false;
      if ((int)pAbcObj0 < iVar1) {
        _k = Gia_ManCi(local_78,(int)pAbcObj0);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pAVar4 = Abc_NtkCi(pNtk_00,(int)pAbcObj0);
      uVar2 = Abc_ObjId(pAVar4);
      _k->Value = uVar2;
      pAbcObj0._0_4_ = (int)pAbcObj0 + 1;
    }
    pAbcObj0._0_4_ = 0;
    while( true ) {
      bVar7 = false;
      if ((int)pAbcObj0 < local_78->nObjs) {
        _k = Gia_ManObj(local_78,(int)pAbcObj0);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        pGVar5 = Gia_ObjFanin0(_k);
        pAVar4 = Abc_NtkObj(pNtk_00,pGVar5->Value);
        pGVar5 = Gia_ObjFanin1(_k);
        pAVar6 = Abc_NtkObj(pNtk_00,pGVar5->Value);
        iVar1 = Gia_ObjFaninC0(_k);
        pAVar4 = Abc_ObjNotCond(pAVar4,iVar1);
        iVar1 = Gia_ObjFaninC1(_k);
        pAVar6 = Abc_ObjNotCond(pAVar6,iVar1);
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar4,pAVar6);
        uVar2 = Abc_ObjId(pAVar4);
        _k->Value = uVar2;
      }
      pAbcObj0._0_4_ = (int)pAbcObj0 + 1;
    }
    pAbcObj0._0_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(local_78->vCos);
      bVar7 = false;
      if ((int)pAbcObj0 < iVar1) {
        _k = Gia_ManCo(local_78,(int)pAbcObj0);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFaninId0p(local_78,_k);
      if (iVar1 == 0) {
        pAVar4 = Abc_AigConst1(pNtk_00);
        pAbcObjPo = Abc_ObjNot(pAVar4);
      }
      else {
        pGVar5 = Gia_ObjFanin0(_k);
        pAbcObjPo = Abc_NtkObj(pNtk_00,pGVar5->Value);
      }
      iVar1 = Gia_ObjFaninC0(_k);
      pAVar4 = Abc_ObjNotCond(pAbcObjPo,iVar1);
      pAVar6 = Abc_NtkCreatePo(pNtk_00);
      Abc_ObjAddFanin(pAVar6,pAVar4);
      pAbcObj0._0_4_ = (int)pAbcObj0 + 1;
    }
  }
  Abc_NtkAddDummyPiNames(pNtk_00);
  Abc_NtkAddDummyPoNames(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateFromGias( char * pName, Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Gia_Man_t * pGia = pMulti ? pMulti : (Gia_Man_t *)Vec_PtrEntry(vGias, 0);
    Abc_Ntk_t * pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    Abc_Obj_t * pAbcObj, * pAbcObjPo;
    Gia_Obj_t * pObj; int i, k;
    pNtk->pName = Extra_UtilStrsav( pName );
    for ( k = 0; k < Gia_ManCiNum(pGia); k++ )
        Abc_NtkCreatePi( pNtk );
    if ( pMulti )
    {
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        Gia_ManForEachCo( pGia, pObj, k )
        {
            //pObj = Gia_ManCo(pGia, 0);
            if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
                pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
            else
                pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
            pAbcObjPo = Abc_NtkCreatePo( pNtk );
            Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
        }
    }
    else
    {
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pGia, i )
    {
        assert( Gia_ManCoNum(pGia) == 1 );
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        pObj = Gia_ManCo(pGia, 0);
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
        else
            pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
        pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
        pAbcObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
    }
    }
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    return pNtk;
}